

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

char * CBS_asn1_oid_to_text(CBS *cbs)

{
  ulong uVar1;
  int iVar2;
  uint64_t v_00;
  uint64_t v;
  CBS copy;
  uint8_t *txt;
  CBB cbb;
  size_t txt_len;
  ulong local_70;
  CBS local_68;
  uint8_t *local_58;
  CBB local_50;
  size_t local_20;
  
  local_68.data = cbs->data;
  local_68.len = cbs->len;
  iVar2 = CBB_init(&local_50,0x20);
  if ((iVar2 != 0) &&
     (iVar2 = parse_base128_integer(&local_68,&local_70), uVar1 = local_70, iVar2 != 0)) {
    if (local_70 < 0x50) {
      iVar2 = add_decimal(&local_50,local_70 / 0x28);
      if ((iVar2 == 0) || (iVar2 = CBB_add_u8(&local_50,'.'), iVar2 == 0)) goto LAB_001791c2;
      v_00 = uVar1 % 0x28;
    }
    else {
      iVar2 = CBB_add_bytes(&local_50,(uint8_t *)"2.",2);
      if (iVar2 == 0) goto LAB_001791c2;
      v_00 = uVar1 - 0x50;
    }
    iVar2 = add_decimal(&local_50,v_00);
    if (iVar2 != 0) {
      while (local_68.len != 0) {
        iVar2 = parse_base128_integer(&local_68,&local_70);
        if (((iVar2 == 0) || (iVar2 = CBB_add_u8(&local_50,'.'), iVar2 == 0)) ||
           (iVar2 = add_decimal(&local_50,local_70), iVar2 == 0)) goto LAB_001791c2;
      }
      iVar2 = CBB_add_u8(&local_50,'\0');
      if ((iVar2 != 0) && (iVar2 = CBB_finish(&local_50,&local_58,&local_20), iVar2 != 0)) {
        return (char *)local_58;
      }
    }
  }
LAB_001791c2:
  CBB_cleanup(&local_50);
  return (char *)0x0;
}

Assistant:

char *CBS_asn1_oid_to_text(const CBS *cbs) {
  CBS copy = *cbs;
  CBB cbb;
  if (!CBB_init(&cbb, 32)) {
    goto err;
  }

  // The first component is 40 * value1 + value2, where value1 is 0, 1, or 2.
  uint64_t v;
  if (!parse_base128_integer(&copy, &v)) {
    goto err;
  }

  if (v >= 80) {
    if (!CBB_add_bytes(&cbb, (const uint8_t *)"2.", 2) ||
        !add_decimal(&cbb, v - 80)) {
      goto err;
    }
  } else if (!add_decimal(&cbb, v / 40) || !CBB_add_u8(&cbb, '.') ||
             !add_decimal(&cbb, v % 40)) {
    goto err;
  }

  while (CBS_len(&copy) != 0) {
    if (!parse_base128_integer(&copy, &v) || !CBB_add_u8(&cbb, '.') ||
        !add_decimal(&cbb, v)) {
      goto err;
    }
  }

  uint8_t *txt;
  size_t txt_len;
  if (!CBB_add_u8(&cbb, '\0') || !CBB_finish(&cbb, &txt, &txt_len)) {
    goto err;
  }

  return (char *)txt;

err:
  CBB_cleanup(&cbb);
  return NULL;
}